

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.hpp
# Opt level: O0

token __thiscall
wigwag::token::
create<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>::handler_node,wigwag::detail::intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>,wigwag::exception_handling::print_to_stderr,wigwag::threading::shared_recursive_mutex,wigwag::state_populating::populator_only,wigwag::life_assurance::intrusive_life_tokens,wigwag::ref_counter::atomic>>&,std::shared_ptr<IObservableDictionaryListener<int,std::__cxx11::string>>>
          (token *this,
          intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
          *args,shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args_1)

{
  handler_node *this_00;
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48 [2];
  intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  local_28;
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local_1;
  intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  *args_local;
  
  local_20 = args_1;
  args_local_1 = (shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)args;
  args_local = (intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
                *)this;
  this_00 = (handler_node *)operator_new(0x40);
  detail::
  intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::intrusive_ptr(&local_28,
                  (intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
                   *)args_local_1);
  std::
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::shared_ptr(local_48,local_20);
  detail::
  listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
  ::handler_node::handler_node(this_00,&local_28,local_48);
  token(this,(implementation *)this_00);
  std::
  shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr(local_48);
  detail::
  intrusive_ptr<wigwag::detail::listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>_>
  ::~intrusive_ptr(&local_28);
  return (token)(implementation *)this;
}

Assistant:

static token create(Args_&&... args)
        { return token(new Implementation_(std::forward<Args_>(args)...)); }